

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O2

Expression *
slang::ast::ForeachLoopStatement::buildLoopDims
          (ForeachLoopListSyntax *loopList,ASTContext *context,
          SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *dims)

{
  Compilation *this;
  size_t sVar1;
  TempVarSymbol *pTVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  byte bVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  NameSyntax *pNVar6;
  IteratorSymbol *pIVar7;
  Symbol *pSVar8;
  SyntaxNode *this_01;
  ConstantRange CVar9;
  Type *pTVar10;
  Type *args_3;
  Diagnostic *pDVar11;
  Type **ppTVar12;
  byte bVar13;
  Type *this_02;
  DiagCode code;
  SourceRange SVar14;
  string_view name;
  const_iterator __begin3;
  Token idName;
  SourceLocation local_38;
  Expression *this_00;
  
  this = ((context->scope).ptr)->compilation;
  iVar5 = Expression::bind((int)(loopList->arrayName).ptr,(sockaddr *)context,0);
  this_00 = (Expression *)CONCAT44(extraout_var,iVar5);
  bVar4 = Expression::bad(this_00);
  if (bVar4) {
    __begin3.index = 0;
    sVar1 = (loopList->loopVariables).elements._M_extent._M_extent_value;
    __begin3.list = &loopList->loopVariables;
    for (; (__begin3.list != &loopList->loopVariables || (__begin3.index != sVar1 + 1 >> 1));
        __begin3.index = __begin3.index + 1) {
      pNVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::
               iterator_base<const_slang::syntax::NameSyntax_*>::dereference(&__begin3);
      if ((pNVar6->super_ExpressionSyntax).super_SyntaxNode.kind == IdentifierName) {
        idName._0_8_ = *(undefined8 *)&pNVar6[1].super_ExpressionSyntax.super_SyntaxNode;
        idName.info = (Info *)pNVar6[1].super_ExpressionSyntax.super_SyntaxNode.parent;
        name = parsing::Token::valueText(&idName);
        local_38 = parsing::Token::location(&idName);
        pIVar7 = BumpAllocator::
                 emplace<slang::ast::IteratorSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::Type_const&,slang::ast::Type_const&>
                           (&this->super_BumpAllocator,
                            (basic_string_view<char,_std::char_traits<char>_> *)&name,&local_38,
                            this->errorType,this->errorType);
        pTVar2 = context->firstTempVar;
        context->firstTempVar = &pIVar7->super_TempVarSymbol;
        (pIVar7->super_TempVarSymbol).nextTemp = pTVar2;
        name._M_str._0_1_ = 0;
        SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::
        emplace_back<slang::ast::ForeachLoopStatement::LoopDim>(dims,(LoopDim *)&name);
      }
    }
  }
  else {
    this_02 = (this_00->type).ptr;
    pSVar8 = Expression::getSymbolReference(this_00,true);
    if ((pSVar8 == (Symbol *)0x0) || (bVar4 = Type::isIterable(this_02), !bVar4)) {
      ASTContext::addDiag(context,(DiagCode)0x300008,this_00->sourceRange);
    }
    else {
      __begin3.index = 0;
      sVar1 = (loopList->loopVariables).elements._M_extent._M_extent_value;
      bVar13 = 0;
      __begin3.list = &loopList->loopVariables;
      while( true ) {
        if ((__begin3.list == &loopList->loopVariables) && (__begin3.index == sVar1 + 1 >> 1)) {
          return this_00;
        }
        this_01 = (SyntaxNode *)
                  slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::
                  iterator_base<const_slang::syntax::NameSyntax_*>::dereference(&__begin3);
        if ((this_02 == (Type *)0x0) || (bVar4 = Type::isScalar(this_02), bVar4)) break;
        bVar4 = Type::hasFixedRange(this_02);
        if (bVar4) {
          CVar9 = Type::getFixedRange(this_02);
          name._M_str._0_1_ = 1;
          name._M_len._0_4_ = CVar9.left;
          name._M_len._4_4_ = CVar9.right;
          SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::
          emplace_back<slang::ast::ForeachLoopStatement::LoopDim>(dims,(LoopDim *)&name);
        }
        else {
          SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::emplace_back<>(dims);
        }
        pTVar10 = Type::getArrayElementType(this_02);
        bVar3 = 1;
        if (this_01->kind != EmptyIdentifierName) {
          name = parsing::Token::valueText((Token *)(this_01 + 1));
          if (((~bVar13 |
               dims->data_[dims->len - 1].range.
               super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ConstantRange>._M_engaged) & 1) == 0) {
            SVar14 = slang::syntax::SyntaxNode::sourceRange(this_01);
            code.subsystem = Statements;
            code.code = 0x1a;
LAB_003da630:
            pDVar11 = ASTContext::addDiag(context,code,SVar14);
            Diagnostic::operator<<(pDVar11,name);
            return (Expression *)0x0;
          }
          __y._M_len = (pSVar8->name)._M_len;
          __y._M_str = (pSVar8->name)._M_str;
          bVar4 = std::operator==(name,__y);
          if (bVar4) {
            SVar14 = slang::syntax::SyntaxNode::sourceRange(this_01);
            code.subsystem = Statements;
            code.code = 0x2b;
            goto LAB_003da630;
          }
          bVar4 = Type::isAssociativeArray(this_02);
          ppTVar12 = &this->intType;
          if (bVar4) {
            args_3 = Type::getAssociativeIndexType(this_02);
            if (args_3 == (Type *)0x0) {
              SVar14 = slang::syntax::SyntaxNode::sourceRange(this_01);
              pDVar11 = ASTContext::addDiag(context,(DiagCode)0x1b0008,SVar14);
              SVar14 = slang::syntax::SyntaxNode::sourceRange
                                 ((SyntaxNode *)(loopList->arrayName).ptr);
              Diagnostic::operator<<(pDVar11,SVar14);
              ppTVar12 = &this->errorType;
              goto LAB_003da529;
            }
          }
          else {
LAB_003da529:
            args_3 = *ppTVar12;
          }
          idName._0_8_ = parsing::Token::location((Token *)(this_01 + 1));
          pIVar7 = BumpAllocator::
                   emplace<slang::ast::IteratorSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation,slang::ast::Type_const&,slang::ast::Type_const&>
                             (&this->super_BumpAllocator,&name,(SourceLocation *)&idName,this_02,
                              args_3);
          pTVar2 = context->firstTempVar;
          context->firstTempVar = &pIVar7->super_TempVarSymbol;
          (pIVar7->super_TempVarSymbol).nextTemp = pTVar2;
          dims->data_[dims->len - 1].loopVar = pIVar7;
          bVar3 = bVar13;
        }
        bVar13 = bVar3;
        __begin3.index = __begin3.index + 1;
        this_02 = pTVar10;
      }
      SVar14 = slang::syntax::SyntaxNode::sourceRange
                         (&(loopList->loopVariables).super_SyntaxListBase.super_SyntaxNode);
      pDVar11 = ASTContext::addDiag(context,(DiagCode)0x4e0008,SVar14);
      ast::operator<<(pDVar11,(this_00->type).ptr);
    }
  }
  return (Expression *)0x0;
}

Assistant:

const Expression* ForeachLoopStatement::buildLoopDims(const ForeachLoopListSyntax& loopList,
                                                      ASTContext& context,
                                                      SmallVectorBase<LoopDim>& dims) {
    // Find the array over which we are looping. Make sure it's actually iterable:
    // - Must be a referenceable variable, class property, etc.
    // - Type can be:
    //    - Any kind of array
    //    - Any multi-dimensional integral type
    //    - A string
    auto& comp = context.getCompilation();
    auto& arrayRef = Expression::bind(*loopList.arrayName, context);
    if (arrayRef.bad()) {
        // Create placeholder iterator symbols to prevent downstream errors.
        for (auto loopVar : loopList.loopVariables) {
            if (loopVar->kind == SyntaxKind::IdentifierName) {
                auto idName = loopVar->as<IdentifierNameSyntax>().identifier;
                auto it = comp.emplace<IteratorSymbol>(idName.valueText(), idName.location(),
                                                       comp.getErrorType(), comp.getErrorType());
                it->nextTemp = std::exchange(context.firstTempVar, it);
                dims.push_back({std::nullopt, it});
            }
        }
        return nullptr;
    }

    const Type* type = arrayRef.type;
    auto arraySym = arrayRef.getSymbolReference();
    if (!arraySym || !type->isIterable()) {
        context.addDiag(diag::NotAnArray, arrayRef.sourceRange);
        return nullptr;
    }

    // Build iterator symbols for each loop variable.
    bool skippedAny = false;
    for (auto loopVar : loopList.loopVariables) {
        // If type is null, we've run out of dimensions so there were too many
        // loop variables supplied.
        if (!type || type->isScalar()) {
            context.addDiag(diag::TooManyForeachVars, loopList.loopVariables.sourceRange())
                << *arrayRef.type;
            return nullptr;
        }

        if (type->hasFixedRange())
            dims.push_back({type->getFixedRange()});
        else
            dims.emplace_back();

        const Type& currType = *type;
        type = type->getArrayElementType();

        // Empty iterator names indicate that we skip this dimension.
        if (loopVar->kind == SyntaxKind::EmptyIdentifierName) {
            skippedAny = true;
            continue;
        }

        auto& idName = loopVar->as<IdentifierNameSyntax>();
        std::string_view name = idName.identifier.valueText();

        // If we previously had skipped dimensions this one can't be dynamically
        // sized (there would be no way to reach it during iteration).
        if (!dims.back().range && skippedAny) {
            context.addDiag(diag::ForeachDynamicDimAfterSkipped, idName.sourceRange()) << name;
            return nullptr;
        }

        if (name == arraySym->name) {
            context.addDiag(diag::LoopVarShadowsArray, loopVar->sourceRange()) << name;
            return nullptr;
        }

        // The type of the iterator is typically an int, unless this dimension
        // is an associative array in which case it's the index type.
        const Type* indexType;
        if (currType.isAssociativeArray()) {
            indexType = currType.getAssociativeIndexType();
            if (!indexType) {
                context.addDiag(diag::ForeachWildcardIndex, loopVar->sourceRange())
                    << loopList.arrayName->sourceRange();
                indexType = &comp.getErrorType();
            }
        }
        else {
            indexType = &comp.getIntType();
        }

        // Build the iterator variable and hook it up to our new context's
        // linked list of iterators.
        auto it = comp.emplace<IteratorSymbol>(name, idName.identifier.location(), currType,
                                               *indexType);
        it->nextTemp = std::exchange(context.firstTempVar, it);
        dims.back().loopVar = it;
    }

    return &arrayRef;
}